

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phi.cpp
# Opt level: O0

int64_t __thiscall anon_unknown.dwarf_3cd89::PhiCache::phi<_1>(PhiCache *this,int64_t x,int64_t a)

{
  bool bVar1;
  reference pvVar2;
  long lVar3;
  reference this_00;
  reference pvVar4;
  long a_00;
  PhiCache *this_01;
  int64_t iVar5;
  size_type *psVar6;
  long lVar7;
  type_conflict1 x_00;
  PhiCache *in_RDX;
  PhiCache *in_RSI;
  uint64_t in_RDI;
  int64_t x2;
  int64_t i;
  int64_t sum;
  int64_t c;
  int64_t pi_sqrtx;
  int64_t sqrtx;
  size_type in_stack_ffffffffffffff88;
  array<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_100UL>
  *in_stack_ffffffffffffff90;
  uint64_t in_stack_ffffffffffffffa8;
  PhiCache *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  long lVar8;
  PhiCache *x_01;
  PhiCache *x_02;
  PhiCache *this_02;
  uint64_t local_8;
  
  this_02 = in_RSI;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x960),(size_type)in_RDX);
  if ((long)*pvVar2 < (long)in_RSI) {
    bVar1 = primesum::is_phi_tiny((int64_t)in_stack_ffffffffffffff90);
    if (bVar1) {
      lVar3 = primesum::phi_tiny<long>(in_RDI,(int64_t)in_stack_ffffffffffffff90);
      local_8 = -lVar3;
    }
    else {
      bVar1 = is_pix(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int64_t)in_RSI);
      if (bVar1) {
        iVar5 = primesum::PiTable::operator[]((PiTable *)in_RSI,in_RDI);
        local_8 = -((iVar5 - (long)in_RDX) + 1);
      }
      else {
        bVar1 = is_cached(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(uint64_t)in_RSI);
        if (bVar1) {
          this_00 = std::array<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_100UL>
                    ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (this_00,(size_type)this_02);
          local_8 = (uint64_t)(int)-(uint)*pvVar4;
        }
        else {
          a_00 = primesum::isqrt<long>((long)in_stack_ffffffffffffff90);
          x_02 = in_RDX;
          this_01 = (PhiCache *)primesum::PhiTiny::get_c(in_stack_ffffffffffffff88);
          lVar8 = 0;
          lVar3 = a_00;
          iVar5 = primesum::PiTable::size(*(PiTable **)(in_RDI + 0x968));
          if (a_00 < iVar5) {
            in_stack_ffffffffffffffb8 = primesum::PiTable::operator[]((PiTable *)in_RSI,in_RDI);
            psVar6 = (size_type *)
                     std::min<long>((long *)&stack0xffffffffffffffb8,
                                    (long *)&stack0xffffffffffffffe0);
            in_RDX = (PhiCache *)*psVar6;
          }
          lVar8 = lVar8 - ((long)in_RDX - (long)x_02);
          lVar7 = primesum::phi_tiny<long>(in_RDI,a_00);
          local_8 = lVar8 - lVar7;
          x_01 = this_01;
          for (; (long)this_01 < (long)in_RDX;
              this_01 = (PhiCache *)
                        ((long)&(this_01->cache_)._M_elems[0].
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1)) {
            std::vector<int,_std::allocator<int>_>::operator[]
                      (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x960),
                       (size_type)
                       ((long)&(this_01->cache_)._M_elems[0].
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1));
            x_00 = primesum::fast_div<long,int>(in_RDI,(int)((ulong)a_00 >> 0x20));
            bVar1 = is_pix(this_01,x_00,(int64_t)in_RSI);
            if (bVar1) {
              iVar5 = primesum::PiTable::operator[]((PiTable *)in_RSI,in_RDI);
              local_8 = (iVar5 - (long)this_01) + 1 + local_8;
            }
            else {
              iVar5 = phi<1>(this_02,(int64_t)x_02,lVar3);
              local_8 = iVar5 + local_8;
            }
          }
          update_cache(in_RDX,(uint64_t)x_01,local_8,in_stack_ffffffffffffffb8);
        }
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

int64_t phi(int64_t x, int64_t a)
  {
    if (x <= primes_[a])
      return SIGN;
    else if (is_phi_tiny(a))
      return phi_tiny(x, a) * SIGN;
    else if (is_pix(x, a))
      return (pi_[x] - a + 1) * SIGN;
    else if (is_cached(x, a))
      return cache_[a][x] * SIGN;

    int64_t sqrtx = isqrt(x);
    int64_t pi_sqrtx = a;
    int64_t c = PhiTiny::get_c(sqrtx);
    int64_t sum = 0;

    if (sqrtx < pi_.size())
      pi_sqrtx = min(pi_[sqrtx], a);

    // Move out of the loop the calculations where phi(x2, i) = 1
    // phi(x, a) = 1 if primes_[a] >= x
    // x2 = x / primes_[i + 1]
    // phi(x2, i) = 1 if primes_[i] >= x / primes_[i + 1]
    // phi(x2, i) = 1 if primes_[i] >= sqrt(x)
    // phi(x2, i) = 1 if i >= pi(sqrt(x))
    // \sum_{i = pi(sqrt(x))}^{a - 1} phi(x2, i) = a - pi(sqrt(x))
    //
    sum += (pi_sqrtx - a) * SIGN;
    sum += phi_tiny(x, c) * SIGN;

    for (int64_t i = c; i < pi_sqrtx; i++)
    {
      int64_t x2 = fast_div(x, primes_[i + 1]);

      if (is_pix(x2, i))
        sum += (pi_[x2] - i + 1) * -SIGN;
      else
        sum += phi<-SIGN>(x2, i);
    }

    update_cache(x, a, sum);

    return sum;
  }